

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O2

bool __thiscall
hash_map<int,_Timer::IdState>::is_key_exist(hash_map<int,_Timer::IdState> *this,int *key)

{
  iterator iVar1;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->hm_mutex);
  iVar1 = std::
          _Hashtable<int,_std::pair<const_int,_Timer::IdState>,_std::allocator<std::pair<const_int,_Timer::IdState>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<int,_std::pair<const_int,_Timer::IdState>,_std::allocator<std::pair<const_int,_Timer::IdState>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,key);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return iVar1.super__Node_iterator_base<std::pair<const_int,_Timer::IdState>,_false>._M_cur !=
         (__node_type *)0x0;
}

Assistant:

bool is_key_exist(const K& key) {
        unique_lock<mutex> lck(hm_mutex);
        return hm_map.find(key) != hm_map.end();
    }